

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spolynomials.cpp
# Opt level: O0

void opengv::absolute_pose::modules::gpnp4::sPolynomial9
               (Matrix<double,_25,_37,_0,_25,_37> *groebnerMatrix)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  Scalar *pSVar5;
  DenseCoeffsBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>,_1> *this;
  Index in_stack_fffffffffffffe98;
  Scalar row;
  DenseCoeffsBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>,_1> *in_stack_fffffffffffffea0;
  
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>,_1>::operator()
                     (in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,0x961046);
  row = *pSVar5;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>,_1>::operator()
                     (in_stack_fffffffffffffea0,(Index)row,0x961066);
  this = (DenseCoeffsBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>,_1> *)(row / *pSVar5);
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>,_1>::operator()
                     (this,(Index)row,0x96108a);
  *pSVar5 = (Scalar)this;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>,_1>::operator()
                     (this,(Index)row,0x9610ab);
  dVar1 = *pSVar5;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>,_1>::operator()
                     (this,(Index)row,0x9610cc);
  dVar2 = *pSVar5;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>,_1>::operator()
                     (this,(Index)row,0x9610f3);
  dVar3 = *pSVar5;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>,_1>::operator()
                     (this,(Index)row,0x961114);
  dVar4 = *pSVar5;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>,_1>::operator()
                     (this,(Index)row,0x961145);
  *pSVar5 = dVar1 / dVar2 - dVar3 / dVar4;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>,_1>::operator()
                     (this,(Index)row,0x961166);
  dVar1 = *pSVar5;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>,_1>::operator()
                     (this,(Index)row,0x961187);
  dVar2 = *pSVar5;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>,_1>::operator()
                     (this,(Index)row,0x9611ae);
  *pSVar5 = dVar1 / dVar2;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>,_1>::operator()
                     (this,(Index)row,0x9611cf);
  dVar1 = *pSVar5;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>,_1>::operator()
                     (this,(Index)row,0x961207);
  dVar2 = *pSVar5;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>,_1>::operator()
                     (this,(Index)row,0x96122e);
  *pSVar5 = -dVar1 / dVar2;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>,_1>::operator()
                     (this,(Index)row,0x96124f);
  dVar1 = *pSVar5;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>,_1>::operator()
                     (this,(Index)row,0x961287);
  dVar2 = *pSVar5;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>,_1>::operator()
                     (this,(Index)row,0x9612ae);
  *pSVar5 = -dVar1 / dVar2;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>,_1>::operator()
                     (this,(Index)row,0x9612cf);
  dVar1 = *pSVar5;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>,_1>::operator()
                     (this,(Index)row,0x9612f0);
  dVar2 = *pSVar5;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>,_1>::operator()
                     (this,(Index)row,0x961317);
  *pSVar5 = dVar1 / dVar2;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>,_1>::operator()
                     (this,(Index)row,0x961338);
  dVar1 = *pSVar5;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>,_1>::operator()
                     (this,(Index)row,0x961359);
  dVar2 = *pSVar5;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>,_1>::operator()
                     (this,(Index)row,0x961383);
  dVar3 = *pSVar5;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>,_1>::operator()
                     (this,(Index)row,0x9613a4);
  dVar4 = *pSVar5;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>,_1>::operator()
                     (this,(Index)row,0x9613db);
  *pSVar5 = dVar1 / dVar2 - dVar3 / dVar4;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>,_1>::operator()
                     (this,(Index)row,0x9613ff);
  dVar1 = *pSVar5;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>,_1>::operator()
                     (this,(Index)row,0x961423);
  dVar2 = *pSVar5;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>,_1>::operator()
                     (this,(Index)row,0x961450);
  *pSVar5 = dVar1 / dVar2;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>,_1>::operator()
                     (this,(Index)row,0x961474);
  dVar1 = *pSVar5;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>,_1>::operator()
                     (this,(Index)row,0x9614af);
  dVar2 = *pSVar5;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>,_1>::operator()
                     (this,(Index)row,0x9614dc);
  *pSVar5 = -dVar1 / dVar2;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>,_1>::operator()
                     (this,(Index)row,0x961500);
  dVar1 = *pSVar5;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>,_1>::operator()
                     (this,(Index)row,0x961524);
  dVar2 = *pSVar5;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>,_1>::operator()
                     (this,(Index)row,0x961551);
  *pSVar5 = dVar1 / dVar2;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>,_1>::operator()
                     (this,(Index)row,0x961575);
  dVar1 = *pSVar5;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>,_1>::operator()
                     (this,(Index)row,0x9615b0);
  dVar2 = *pSVar5;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>,_1>::operator()
                     (this,(Index)row,0x9615dd);
  *pSVar5 = -dVar1 / dVar2;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>,_1>::operator()
                     (this,(Index)row,0x961601);
  dVar1 = *pSVar5;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>,_1>::operator()
                     (this,(Index)row,0x96163c);
  dVar2 = *pSVar5;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>,_1>::operator()
                     (this,(Index)row,0x961669);
  *pSVar5 = -dVar1 / dVar2;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>,_1>::operator()
                     (this,(Index)row,0x96168d);
  dVar1 = *pSVar5;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>,_1>::operator()
                     (this,(Index)row,0x9616b1);
  dVar2 = *pSVar5;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>,_1>::operator()
                     (this,(Index)row,0x9616de);
  *pSVar5 = dVar1 / dVar2;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>,_1>::operator()
                     (this,(Index)row,0x961702);
  dVar1 = *pSVar5;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>,_1>::operator()
                     (this,(Index)row,0x961726);
  dVar2 = *pSVar5;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>,_1>::operator()
                     (this,(Index)row,0x961753);
  dVar3 = *pSVar5;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>,_1>::operator()
                     (this,(Index)row,0x961777);
  dVar4 = *pSVar5;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>,_1>::operator()
                     (this,(Index)row,0x9617b1);
  *pSVar5 = dVar1 / dVar2 - dVar3 / dVar4;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>,_1>::operator()
                     (this,(Index)row,0x9617d5);
  dVar1 = *pSVar5;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>,_1>::operator()
                     (this,(Index)row,0x9617f9);
  dVar2 = *pSVar5;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>,_1>::operator()
                     (this,(Index)row,0x961826);
  *pSVar5 = dVar1 / dVar2;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>,_1>::operator()
                     (this,(Index)row,0x96184a);
  dVar1 = *pSVar5;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>,_1>::operator()
                     (this,(Index)row,0x961885);
  dVar2 = *pSVar5;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>,_1>::operator()
                     (this,(Index)row,0x9618b2);
  *pSVar5 = -dVar1 / dVar2;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>,_1>::operator()
                     (this,(Index)row,0x9618d6);
  dVar1 = *pSVar5;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>,_1>::operator()
                     (this,(Index)row,0x9618fa);
  dVar2 = *pSVar5;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>,_1>::operator()
                     (this,(Index)row,0x961927);
  *pSVar5 = dVar1 / dVar2;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>,_1>::operator()
                     (this,(Index)row,0x96194b);
  dVar1 = *pSVar5;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>,_1>::operator()
                     (this,(Index)row,0x961986);
  dVar2 = *pSVar5;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>,_1>::operator()
                     (this,(Index)row,0x9619b3);
  *pSVar5 = -dVar1 / dVar2;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>,_1>::operator()
                     (this,(Index)row,0x9619d7);
  dVar1 = *pSVar5;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>,_1>::operator()
                     (this,(Index)row,0x9619fb);
  dVar2 = *pSVar5;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>,_1>::operator()
                     (this,(Index)row,0x961a28);
  *pSVar5 = dVar1 / dVar2;
  return;
}

Assistant:

void
opengv::absolute_pose::modules::gpnp4::sPolynomial9( Eigen::Matrix<double,25,37> & groebnerMatrix )
{
  groebnerMatrix(9,9) = groebnerMatrix(6,25)/(groebnerMatrix(6,24));
  groebnerMatrix(9,10) = (groebnerMatrix(6,26)/(groebnerMatrix(6,24))-groebnerMatrix(8,27)/(groebnerMatrix(8,26)));
  groebnerMatrix(9,11) = groebnerMatrix(6,27)/(groebnerMatrix(6,24));
  groebnerMatrix(9,13) = -groebnerMatrix(8,28)/(groebnerMatrix(8,26));
  groebnerMatrix(9,14) = -groebnerMatrix(8,29)/(groebnerMatrix(8,26));
  groebnerMatrix(9,15) = groebnerMatrix(6,28)/(groebnerMatrix(6,24));
  groebnerMatrix(9,16) = (groebnerMatrix(6,29)/(groebnerMatrix(6,24))-groebnerMatrix(8,30)/(groebnerMatrix(8,26)));
  groebnerMatrix(9,17) = groebnerMatrix(6,30)/(groebnerMatrix(6,24));
  groebnerMatrix(9,19) = -groebnerMatrix(8,31)/(groebnerMatrix(8,26));
  groebnerMatrix(9,20) = groebnerMatrix(6,31)/(groebnerMatrix(6,24));
  groebnerMatrix(9,23) = -groebnerMatrix(8,32)/(groebnerMatrix(8,26));
  groebnerMatrix(9,24) = -groebnerMatrix(8,33)/(groebnerMatrix(8,26));
  groebnerMatrix(9,25) = groebnerMatrix(6,32)/(groebnerMatrix(6,24));
  groebnerMatrix(9,26) = (groebnerMatrix(6,33)/(groebnerMatrix(6,24))-groebnerMatrix(8,34)/(groebnerMatrix(8,26)));
  groebnerMatrix(9,27) = groebnerMatrix(6,34)/(groebnerMatrix(6,24));
  groebnerMatrix(9,29) = -groebnerMatrix(8,35)/(groebnerMatrix(8,26));
  groebnerMatrix(9,30) = groebnerMatrix(6,35)/(groebnerMatrix(6,24));
  groebnerMatrix(9,33) = -groebnerMatrix(8,36)/(groebnerMatrix(8,26));
  groebnerMatrix(9,34) = groebnerMatrix(6,36)/(groebnerMatrix(6,24));
}